

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeSegment::Create(ON_PolyEdgeSegment *this,ON_BrepTrim *trim,ON_UUID *object_id)

{
  double t0;
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  ON_Brep *pOVar4;
  ON_BrepEdge *this_00;
  ON_Curve *real_curve;
  ON_BrepFace *pOVar5;
  ON_Surface *pOVar6;
  double *pdVar7;
  ON_COMPONENT_INDEX OVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  ON_Interval real_curve_subdomain;
  ON_Curve *c3;
  ON_BrepEdge *edge;
  ON_Brep *brep;
  ON_UUID *object_id_local;
  ON_BrepTrim *trim_local;
  ON_PolyEdgeSegment *this_local;
  int extraout_var;
  
  Init(this);
  if (trim == (ON_BrepTrim *)0x0) {
    this_local._7_1_ = false;
  }
  else if (trim->m_ei < 0) {
    pOVar4 = ON_BrepTrim::Brep(trim);
    if (pOVar4 == (ON_Brep *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = ON_BrepTrim::Edge(trim);
      if (this_00 == (ON_BrepEdge *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        real_curve = ON_BrepEdge::EdgeCurveOf(this_00);
        if (real_curve == (ON_Curve *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          this->m_brep = pOVar4;
          this->m_trim = trim;
          this->m_edge = this_00;
          pOVar5 = ON_BrepTrim::Face(trim);
          this->m_face = pOVar5;
          if (this->m_face != (ON_BrepFace *)0x0) {
            pOVar6 = ON_BrepFace::SurfaceOf(this->m_face);
            this->m_surface = pOVar6;
          }
          (*(this->m_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x25])();
          (this->m_edge_domain).m_t[0] = extraout_XMM0_Qa;
          (this->m_edge_domain).m_t[1] = in_XMM1_Qa;
          (*(this->m_trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x25])();
          (this->m_trim_domain).m_t[0] = extraout_XMM0_Qa_00;
          (this->m_trim_domain).m_t[1] = in_XMM1_Qa;
          real_curve_subdomain = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
          ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,real_curve,real_curve_subdomain);
          bVar3 = ON_CurveProxy::ProxyCurveIsReversed(&this->m_edge->super_ON_CurveProxy);
          if (bVar3) {
            ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
          }
          pdVar7 = ON_Interval::operator[](&this->m_edge_domain,0);
          t0 = *pdVar7;
          pdVar7 = ON_Interval::operator[](&this->m_edge_domain,1);
          ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,t0,*pdVar7);
          OVar8.m_type = (*(trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                           super_ON_Object._vptr_ON_Object[0x22])();
          OVar8.m_index = extraout_var;
          this->m_component_index = OVar8;
          uVar1 = object_id->Data2;
          uVar2 = object_id->Data3;
          (this->m_object_id).Data1 = object_id->Data1;
          (this->m_object_id).Data2 = uVar1;
          (this->m_object_id).Data3 = uVar2;
          *(undefined8 *)(this->m_object_id).Data4 = *(undefined8 *)object_id->Data4;
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyEdgeSegment::Create( 
                const ON_BrepTrim* trim,
                const ON_UUID& object_id
                )
{
  Init();
  if ( !trim )
    return false;
  if ( trim->m_ei >= 0 )
    return false;
  const ON_Brep* brep = trim->Brep();
  if ( !brep )
    return false;
  const ON_BrepEdge* edge = trim->Edge();
  if ( !edge )
    return false;
  const ON_Curve* c3 = edge->EdgeCurveOf();
  if ( !c3 )
    return false;
  m_brep = brep;
  m_trim = trim;
  m_edge = edge;
  m_face = trim->Face();
  if ( m_face )
    m_surface = m_face->SurfaceOf();
  m_edge_domain = m_edge->Domain();
  m_trim_domain = m_trim->Domain();
  ON_CurveProxy::SetProxyCurve( 
                    c3,
                    edge->ProxyCurveDomain()
                    );    
  if ( m_edge->ProxyCurveIsReversed() )
    ON_CurveProxy::Reverse();
  ON_CurveProxy::SetDomain( m_edge_domain[0], m_edge_domain[1] );
  m_component_index = trim->ComponentIndex();
  m_object_id = object_id;
  return true;
}